

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

opj_mutex_t * opj_mutex_create(void)

{
  int iVar1;
  pthread_mutex_t *local_10;
  opj_mutex_t *mutex;
  
  local_10 = (pthread_mutex_t *)opj_calloc(1,0x28);
  if ((local_10 != (pthread_mutex_t *)0x0) &&
     (iVar1 = pthread_mutex_init(local_10,(pthread_mutexattr_t *)0x0), iVar1 != 0)) {
    opj_free(local_10);
    local_10 = (pthread_mutex_t *)0x0;
  }
  return (opj_mutex_t *)local_10;
}

Assistant:

opj_mutex_t* opj_mutex_create(void)
{
    opj_mutex_t* mutex = (opj_mutex_t*) opj_calloc(1U, sizeof(opj_mutex_t));
    if (mutex != NULL) {
        if (pthread_mutex_init(&mutex->mutex, NULL) != 0) {
            opj_free(mutex);
            mutex = NULL;
        }
    }
    return mutex;
}